

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  byte bVar2;
  void *pvVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uchar *puVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar15;
  int iVar16;
  uint uVar17;
  undefined4 in_register_00000034;
  uint uVar18;
  int res_3;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  uchar **hash_table [16384];
  int iStack_20090;
  uint uStack_2008c;
  uchar *puStack_20088;
  ulong uStack_20080;
  ulong uStack_20078;
  uchar *puStack_20070;
  int iStack_20068;
  int iStack_20064;
  ulong uStack_20060;
  int *piStack_20058;
  size_t sStack_20050;
  ulong uStack_20048;
  long lStack_20040;
  void *apvStack_20038 [16385];
  
  uStack_20080 = CONCAT44(in_register_00000034,data_len);
  uStack_2008c = 0;
  iStack_20090 = 0;
  puStack_20088 = (uchar *)0x0;
  uStack_20060 = 5;
  if (5 < quality) {
    uStack_20060 = (ulong)(uint)quality;
  }
  piStack_20058 = out_len;
  stbiw__sbgrowf(&puStack_20088,1,(int)out_len);
  iVar16 = *(int *)(puStack_20088 + -4);
  iVar14 = iVar16 + 1;
  *(int *)(puStack_20088 + -4) = iVar14;
  puStack_20088[iVar16] = 'x';
  if ((puStack_20088 == (uchar *)0x0) ||
     (*(int *)(puStack_20088 + -8) <= *(int *)(puStack_20088 + -4) + 1)) {
    stbiw__sbgrowf(&puStack_20088,1,iVar14);
  }
  iVar16 = *(int *)(puStack_20088 + -4);
  *(int *)(puStack_20088 + -4) = iVar16 + 1;
  puStack_20088[iVar16] = '^';
  uStack_2008c = 1;
  iStack_20090 = 1;
  puStack_20088 = stbiw__zlib_flushf(puStack_20088,&uStack_2008c,&iStack_20090);
  uStack_2008c = uStack_2008c | 1 << ((byte)iStack_20090 & 0x1f);
  iStack_20090 = iStack_20090 + 2;
  puStack_20088 = stbiw__zlib_flushf(puStack_20088,&uStack_2008c,&iStack_20090);
  uVar6 = 0;
  puStack_20070 = puStack_20088;
  memset(apvStack_20038,0,0x20000);
  if (3 < (int)uStack_20080) {
    iStack_20064 = (int)uStack_20080 + -3;
    iStack_20068 = (int)uStack_20060 * 2;
    uStack_20048 = uStack_20060 & 0xffffffff;
    sStack_20050 = uStack_20048 * 8;
    uVar8 = 0;
    do {
      iVar16 = (int)uVar8;
      lStack_20040 = (long)iVar16;
      uVar6 = (uint)CONCAT12(data[lStack_20040 + 2],*(undefined2 *)(data + lStack_20040)) * 8 ^
              (uint)CONCAT12(data[lStack_20040 + 2],*(undefined2 *)(data + lStack_20040));
      uVar6 = (uVar6 >> 5) + uVar6;
      uVar6 = uVar6 * 0x10 ^ uVar6;
      uVar6 = (uVar6 >> 0x11) + uVar6;
      uVar7 = (uVar6 >> 6) + uVar6 & 0x3fff;
      pvVar3 = apvStack_20038[uVar7];
      uVar6 = 0;
      if (pvVar3 != (void *)0x0) {
        uVar6 = *(uint *)((long)pvVar3 + -4);
      }
      pbVar1 = data + lStack_20040;
      iVar14 = (int)uStack_20080;
      if ((int)uVar6 < 1) {
        iVar12 = 3;
        lVar22 = 0;
      }
      else {
        iVar14 = iVar14 - iVar16;
        uVar17 = iVar14 - 1;
        if (0x100 < uVar17) {
          uVar17 = 0x101;
        }
        iVar12 = 3;
        uVar19 = 0;
        lVar22 = 0;
        do {
          lVar4 = *(long *)((long)pvVar3 + uVar19 * 8);
          if ((long)(iVar16 + -0x8000) < lVar4 - (long)data) {
            uVar21 = 0;
            if (0 < iVar14) {
              do {
                if (*(byte *)(lVar4 + uVar21) != pbVar1[uVar21]) goto LAB_0010ae61;
                uVar21 = uVar21 + 1;
              } while (uVar17 + 1 != uVar21);
              uVar21 = (ulong)(uVar17 + 1);
            }
LAB_0010ae61:
            iVar20 = (int)uVar21;
            iVar11 = iVar12;
            if (iVar12 < iVar20) {
              iVar11 = iVar20;
            }
            bVar5 = iVar12 <= iVar20;
            iVar12 = iVar11;
            if (bVar5) {
              lVar22 = lVar4;
            }
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar6);
      }
      uStack_20078 = uVar8;
      if (pvVar3 == (void *)0x0) {
LAB_0010aecd:
        stbiw__sbgrowf(apvStack_20038 + uVar7,8,iVar14);
      }
      else {
        if (*(int *)((long)pvVar3 + -4) == iStack_20068) {
          memmove(pvVar3,(void *)(uStack_20048 * 8 + (long)pvVar3),sStack_20050);
          *(int *)((long)pvVar3 + -4) = (int)uStack_20060;
          iVar14 = extraout_EDX;
        }
        if ((pvVar3 == (void *)0x0) ||
           (*(int *)((long)pvVar3 + -8) <= *(int *)((long)pvVar3 + -4) + 1)) goto LAB_0010aecd;
      }
      pvVar3 = apvStack_20038[uVar7];
      iVar16 = *(int *)((long)pvVar3 + -4);
      *(int *)((long)pvVar3 + -4) = iVar16 + 1;
      *(byte **)((long)pvVar3 + (long)iVar16 * 8) = pbVar1;
      uVar6 = (uint)uStack_20078;
      if (lVar22 == 0) {
        lVar22 = 0;
      }
      else {
        uVar7 = (uint)*(uint3 *)(pbVar1 + 1) * 8 ^ (uint)*(uint3 *)(pbVar1 + 1);
        uVar7 = (uVar7 >> 5) + uVar7;
        uVar7 = uVar7 * 0x10 ^ uVar7;
        uVar7 = (uVar7 >> 0x11) + uVar7;
        pvVar3 = apvStack_20038[(uVar7 >> 6) + uVar7 & 0x3fff];
        if (pvVar3 == (void *)0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)*(uint *)((long)pvVar3 + -4);
        }
        if (0 < (int)uVar8) {
          uVar7 = (~uVar6 + (int)uStack_20080) - 1;
          if (0x100 < uVar7) {
            uVar7 = 0x101;
          }
          uVar19 = 0;
          do {
            lVar4 = *(long *)((long)pvVar3 + uVar19 * 8);
            if ((long)(int)(uVar6 - 0x7fff) < lVar4 - (long)data) {
              uVar21 = 0;
              if (0 < (int)(~uVar6 + (int)uStack_20080)) {
                do {
                  if (*(uchar *)(lVar4 + uVar21) != data[uVar21 + lStack_20040 + 1])
                  goto LAB_0010afb7;
                  uVar21 = uVar21 + 1;
                } while (uVar7 + 1 != uVar21);
                uVar21 = (ulong)(uVar7 + 1);
              }
LAB_0010afb7:
              if (iVar12 < (int)uVar21) {
                lVar22 = 0;
                break;
              }
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar8);
        }
      }
      bVar10 = (byte)iStack_20090;
      if (lVar22 == 0) {
        bVar2 = *pbVar1;
        if (bVar2 < 0x90) {
          uVar7 = bVar2 + 0x30;
          iVar16 = 0;
          iVar14 = -8;
          do {
            iVar16 = (uVar7 & 1) + iVar16 * 2;
            uVar7 = uVar7 >> 1;
            iVar14 = iVar14 + 1;
          } while (iVar14 != 0);
          uVar7 = iVar16 << (bVar10 & 0x1f);
          iStack_20090 = iStack_20090 + 8;
        }
        else {
          uVar7 = bVar2 | 0x100;
          iVar16 = 0;
          iVar14 = -9;
          do {
            iVar16 = (uVar7 & 1) + iVar16 * 2;
            uVar7 = uVar7 >> 1;
            iVar14 = iVar14 + 1;
          } while (iVar14 != 0);
          uVar7 = iVar16 << (bVar10 & 0x1f);
          iStack_20090 = iStack_20090 + 9;
        }
        uStack_2008c = uStack_2008c | uVar7;
        iVar12 = 1;
        puVar9 = puStack_20070;
LAB_0010b1cc:
        puVar9 = stbiw__zlib_flushf(puVar9,&uStack_2008c,&iStack_20090);
      }
      else {
        iVar16 = (int)pbVar1 - (int)lVar22;
        uVar8 = 0;
        do {
          uVar19 = uVar8;
          uVar8 = uVar19 + 1;
        } while ((int)(uint)stbi_zlib_compress::lengthc[uVar19 + 1] <= iVar12);
        if (uVar19 < 0x17) {
          iVar14 = 0;
          iVar11 = -7;
          do {
            iVar14 = ((uint)uVar8 & 1) + iVar14 * 2;
            uVar8 = (ulong)((uint)uVar8 >> 1);
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
          uVar6 = iVar14 << (bVar10 & 0x1f);
          iStack_20090 = iStack_20090 + 7;
        }
        else {
          uVar6 = (int)uVar8 + 0xa8;
          iVar14 = 0;
          iVar11 = -8;
          do {
            iVar14 = (uVar6 & 1) + iVar14 * 2;
            uVar6 = uVar6 >> 1;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
          uVar6 = iVar14 << (bVar10 & 0x1f);
          iStack_20090 = iStack_20090 + 8;
        }
        uStack_2008c = uStack_2008c | uVar6;
        puVar9 = stbiw__zlib_flushf(puStack_20070,&uStack_2008c,&iStack_20090);
        uVar19 = uVar19 & 0xffffffff;
        if (0xffffffffffffffeb < uVar19 - 0x1c) {
          uStack_2008c = uStack_2008c |
                         iVar12 - (uint)stbi_zlib_compress::lengthc[uVar19] <<
                         ((byte)iStack_20090 & 0x1f);
          iStack_20090 = (uint)""[uVar19] + iStack_20090;
          puVar9 = stbiw__zlib_flushf(puVar9,&uStack_2008c,&iStack_20090);
        }
        uVar8 = 0xffffffffffffffff;
        do {
          lVar22 = uVar8 + 2;
          uVar8 = uVar8 + 1;
        } while ((int)(uint)stbi_zlib_compress::distc[lVar22] <= iVar16);
        iVar14 = 0;
        iVar11 = -5;
        uVar19 = uVar8 & 0xffffffff;
        do {
          iVar14 = ((uint)uVar19 & 1) + iVar14 * 2;
          uVar19 = uVar19 >> 1;
          iVar11 = iVar11 + 1;
        } while (iVar11 != 0);
        uStack_2008c = uStack_2008c | iVar14 << ((byte)iStack_20090 & 0x1f);
        iStack_20090 = iStack_20090 + 5;
        puVar9 = stbiw__zlib_flushf(puVar9,&uStack_2008c,&iStack_20090);
        uVar6 = (uint)uStack_20078;
        if (3 < uVar8) {
          uStack_2008c = uStack_2008c |
                         iVar16 - (uint)stbi_zlib_compress::distc[uVar8 & 0xffffffff] <<
                         ((byte)iStack_20090 & 0x1f);
          iStack_20090 = (uint)""[uVar8 & 0xffffffff] + iStack_20090;
          goto LAB_0010b1cc;
        }
      }
      uVar6 = iVar12 + uVar6;
      uVar8 = (ulong)uVar6;
      puStack_20070 = puVar9;
    } while ((int)uVar6 < iStack_20064);
  }
  puStack_20088 = puStack_20070;
  iVar16 = (int)uStack_20080;
  puVar9 = puStack_20070;
  if ((int)uVar6 < (int)uStack_20080) {
    lVar22 = (long)(int)uVar6;
    do {
      bVar10 = data[lVar22];
      if (bVar10 < 0x90) {
        uVar6 = bVar10 + 0x30;
        iVar14 = 0;
        iVar12 = -8;
        do {
          iVar14 = (uVar6 & 1) + iVar14 * 2;
          uVar6 = uVar6 >> 1;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 0);
        uVar6 = iVar14 << ((byte)iStack_20090 & 0x1f);
        iStack_20090 = iStack_20090 + 8;
      }
      else {
        uVar6 = bVar10 | 0x100;
        iVar14 = 0;
        iVar12 = -9;
        do {
          iVar14 = (uVar6 & 1) + iVar14 * 2;
          uVar6 = uVar6 >> 1;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 0);
        uVar6 = iVar14 << ((byte)iStack_20090 & 0x1f);
        iStack_20090 = iStack_20090 + 9;
      }
      uStack_2008c = uStack_2008c | uVar6;
      puVar9 = stbiw__zlib_flushf(puVar9,&uStack_2008c,&iStack_20090);
      lVar22 = lVar22 + 1;
    } while ((int)lVar22 != iVar16);
  }
  iStack_20090 = iStack_20090 + 7;
  puStack_20088 = puVar9;
  puVar9 = stbiw__zlib_flushf(puVar9,&uStack_2008c,&iStack_20090);
  uVar15 = extraout_RDX;
  if (iStack_20090 != 0) {
    do {
      iStack_20090 = iStack_20090 + 1;
      puVar9 = stbiw__zlib_flushf(puVar9,&uStack_2008c,&iStack_20090);
      uVar15 = extraout_RDX_00;
    } while (iStack_20090 != 0);
  }
  uVar8 = uStack_20080;
  lVar22 = 0;
  puStack_20088 = puVar9;
  do {
    if (apvStack_20038[lVar22] != (void *)0x0) {
      free((void *)((long)apvStack_20038[lVar22] + -8));
      uVar15 = extraout_RDX_01;
    }
    iVar16 = (int)uVar15;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x4000);
  iVar14 = (int)uVar8;
  if (iVar14 < 1) {
    uVar6 = 0;
    uVar7 = 1;
  }
  else {
    uVar17 = iVar14 + (int)((uVar8 & 0xffffffff) / 0x15b0) * -0x15b0;
    uVar7 = 1;
    uVar13 = 0;
    iVar16 = -0x7ff87f8f;
    uVar6 = 0;
    do {
      if (uVar17 != 0) {
        uVar8 = (ulong)uVar17;
        uVar18 = uVar13;
        do {
          uVar7 = uVar7 + data[uVar18];
          uVar6 = uVar6 + uVar7;
          uVar18 = uVar18 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
        uVar7 = uVar7 % 0xfff1;
        uVar6 = uVar6 % 0xfff1;
      }
      uVar13 = uVar13 + uVar17;
      uVar17 = 0x15b0;
    } while ((int)uVar13 < iVar14);
  }
  if ((puVar9 == (uchar *)0x0) || (*(int *)(puVar9 + -8) <= *(int *)(puVar9 + -4) + 1)) {
    stbiw__sbgrowf(&puStack_20088,1,iVar16);
  }
  iVar16 = *(int *)(puStack_20088 + -4);
  iVar14 = iVar16 + 1;
  *(int *)(puStack_20088 + -4) = iVar14;
  puStack_20088[iVar16] = (uchar)(uVar6 >> 8);
  if ((puStack_20088 == (uchar *)0x0) ||
     (*(int *)(puStack_20088 + -8) <= *(int *)(puStack_20088 + -4) + 1)) {
    stbiw__sbgrowf(&puStack_20088,1,iVar14);
  }
  iVar16 = *(int *)(puStack_20088 + -4);
  iVar14 = iVar16 + 1;
  *(int *)(puStack_20088 + -4) = iVar14;
  puStack_20088[iVar16] = (uchar)uVar6;
  if ((puStack_20088 == (uchar *)0x0) ||
     (*(int *)(puStack_20088 + -8) <= *(int *)(puStack_20088 + -4) + 1)) {
    stbiw__sbgrowf(&puStack_20088,1,iVar14);
  }
  iVar16 = *(int *)(puStack_20088 + -4);
  iVar14 = iVar16 + 1;
  *(int *)(puStack_20088 + -4) = iVar14;
  puStack_20088[iVar16] = (uchar)(uVar7 >> 8);
  if ((puStack_20088 == (uchar *)0x0) ||
     (*(int *)(puStack_20088 + -8) <= *(int *)(puStack_20088 + -4) + 1)) {
    stbiw__sbgrowf(&puStack_20088,1,iVar14);
  }
  iVar16 = *(int *)(puStack_20088 + -4);
  *(int *)(puStack_20088 + -4) = iVar16 + 1;
  puStack_20088[iVar16] = (uchar)uVar7;
  iVar16 = *(int *)(puStack_20088 + -4);
  *piStack_20058 = iVar16;
  puVar9 = (uchar *)memmove(puStack_20088 + -8,puStack_20088,(long)iVar16);
  return puVar9;
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char **hash_table[stbiw__ZHASH]; // 64KB on the stack!
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);

   {
      // compute adler32 on input
      unsigned int i=0, s1=1, s2=0, blocklen = data_len % 5552;
      int j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, (unsigned char) (s2 >> 8));
      stbiw__sbpush(out, (unsigned char) s2);
      stbiw__sbpush(out, (unsigned char) (s1 >> 8));
      stbiw__sbpush(out, (unsigned char) s1);
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}